

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O1

void __thiscall UniValue::~UniValue(UniValue *this)

{
  pointer pcVar1;
  
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&this->values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->keys);
  pcVar1 = (this->val)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->val).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~UniValue() {}